

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void constInsert(WhereConst *pConst,Expr *pColumn,Expr *pValue)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Expr **ppEVar5;
  ulong uVar6;
  
  uVar1 = pConst->nConst;
  lVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  while( true ) {
    if (uVar6 * 0x10 == lVar4) {
      pConst->nConst = (int)((long)(int)uVar1 + 1);
      ppEVar5 = (Expr **)sqlite3DbReallocOrFree
                                   (pConst->pParse->db,pConst->apExpr,((long)(int)uVar1 + 1) * 0x10)
      ;
      pConst->apExpr = ppEVar5;
      if (ppEVar5 == (Expr **)0x0) {
        pConst->nConst = 0;
      }
      else {
        if ((pValue->flags & 8) != 0) {
          pValue = pValue->pLeft;
        }
        iVar2 = pConst->nConst;
        ppEVar5[(long)iVar2 * 2 + -2] = pColumn;
        pConst->apExpr[(long)iVar2 * 2 + -1] = pValue;
      }
      return;
    }
    lVar3 = *(long *)((long)pConst->apExpr + lVar4);
    if ((*(int *)(lVar3 + 0x2c) == pColumn->iTable) &&
       (*(short *)(lVar3 + 0x30) == pColumn->iColumn)) break;
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

static void constInsert(
  WhereConst *pConst,      /* The WhereConst into which we are inserting */
  Expr *pColumn,           /* The COLUMN part of the constraint */
  Expr *pValue             /* The VALUE part of the constraint */
){
  int i;
  assert( pColumn->op==TK_COLUMN );

  /* 2018-10-25 ticket [cf5ed20f]
  ** Make sure the same pColumn is not inserted more than once */
  for(i=0; i<pConst->nConst; i++){
    const Expr *pExpr = pConst->apExpr[i*2];
    assert( pExpr->op==TK_COLUMN );
    if( pExpr->iTable==pColumn->iTable
     && pExpr->iColumn==pColumn->iColumn
    ){
      return;  /* Already present.  Return without doing anything. */
    }
  }

  pConst->nConst++;
  pConst->apExpr = sqlite3DbReallocOrFree(pConst->pParse->db, pConst->apExpr,
                         pConst->nConst*2*sizeof(Expr*));
  if( pConst->apExpr==0 ){
    pConst->nConst = 0;
  }else{
    if( ExprHasProperty(pValue, EP_FixedCol) ) pValue = pValue->pLeft;
    pConst->apExpr[pConst->nConst*2-2] = pColumn;
    pConst->apExpr[pConst->nConst*2-1] = pValue;
  }
}